

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O3

int Fra_ClausInductiveClauses(Clu_Man_t *p)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  sat_solver *psVar7;
  Vec_Int_t *pVVar8;
  Vec_Int_t *pVVar9;
  long lVar10;
  char *__s;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int local_40;
  
  p->fFail = 0;
  if (p->pSatMain != (sat_solver *)0x0) {
    sat_solver_delete(p->pSatMain);
  }
  psVar7 = (sat_solver *)Cnf_DataWriteIntoSolver(p->pCnf,p->nFrames + 1,0);
  p->pSatMain = psVar7;
  if (psVar7 != (sat_solver *)0x0) {
    Fra_ClausSimInfoClean(p);
    iVar4 = p->pCnf->nVars * 2;
    pVVar9 = p->vLitsProven;
    iVar5 = p->nFrames;
    if (iVar5 < 1) {
      iVar6 = pVVar9->nSize;
    }
    else {
      piVar2 = pVVar9->pArray;
      pVVar8 = p->vClausesProven;
      iVar11 = 0;
      do {
        if (0 < pVVar8->nSize) {
          lVar12 = 0;
          iVar5 = 0;
          do {
            iVar6 = pVVar8->pArray[lVar12];
            if (p->nLutSize < iVar6 - iVar5) {
              __assert_fail("End - Beg <= p->nLutSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraClaus.c"
                            ,0x47c,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
            }
            iVar5 = sat_solver_addclause(p->pSatMain,piVar2 + iVar5,piVar2 + iVar6);
            if (iVar5 == 0) goto LAB_0069a6a6;
            lVar12 = lVar12 + 1;
            pVVar8 = p->vClausesProven;
            iVar5 = iVar6;
          } while (lVar12 < pVVar8->nSize);
          pVVar9 = p->vLitsProven;
        }
        iVar6 = pVVar9->nSize;
        if (0 < iVar6) {
          piVar3 = pVVar9->pArray;
          lVar12 = 0;
          do {
            piVar3[lVar12] = piVar3[lVar12] + iVar4;
            lVar12 = lVar12 + 1;
            iVar6 = pVVar9->nSize;
          } while (lVar12 < iVar6);
        }
        iVar11 = iVar11 + 1;
        iVar5 = p->nFrames;
      } while (iVar11 < iVar5);
    }
    if (0 < iVar6) {
      piVar2 = pVVar9->pArray;
      lVar12 = 0;
      do {
        piVar2[lVar12] = piVar2[lVar12] - iVar5 * iVar4;
        lVar12 = lVar12 + 1;
      } while (lVar12 < pVVar9->nSize);
      iVar5 = p->nFrames;
    }
    pVVar9 = p->vLits;
    iVar4 = p->pCnf->nVars * 2;
    piVar2 = pVVar9->pArray;
    if (0 < iVar5) {
      pVVar8 = p->vClauses;
      iVar5 = 0;
      do {
        if (0 < pVVar8->nSize) {
          lVar12 = 0;
          iVar6 = 0;
          do {
            if (p->vCosts->nSize <= lVar12) goto LAB_0069a92d;
            iVar11 = pVVar8->pArray[lVar12];
            iVar1 = p->vCosts->pArray[lVar12];
            if (iVar1 != -1) {
              if (iVar1 < 1) {
                __assert_fail("Vec_IntEntry( p->vCosts, i ) > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraClaus.c"
                              ,0x4af,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
              }
              if (p->nLutSize < iVar11 - iVar6) {
                __assert_fail("End - Beg <= p->nLutSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraClaus.c"
                              ,0x4b0,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
              }
              iVar6 = sat_solver_addclause(p->pSatMain,piVar2 + iVar6,piVar2 + iVar11);
              if (iVar6 == 0) goto LAB_0069a6a6;
              pVVar8 = p->vClauses;
            }
            lVar12 = lVar12 + 1;
            iVar6 = iVar11;
          } while (lVar12 < pVVar8->nSize);
          pVVar9 = p->vLits;
        }
        if (0 < pVVar9->nSize) {
          piVar3 = pVVar9->pArray;
          lVar12 = 0;
          do {
            piVar3[lVar12] = piVar3[lVar12] + iVar4;
            lVar12 = lVar12 + 1;
          } while (lVar12 < pVVar9->nSize);
        }
        iVar5 = iVar5 + 1;
      } while (iVar5 < p->nFrames);
    }
    psVar7 = p->pSatMain;
    if (psVar7->qtail != psVar7->qhead) {
      iVar5 = sat_solver_simplify(psVar7);
      if (iVar5 == 0) {
        __assert_fail("RetValue != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraClaus.c"
                      ,0x4c3,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
      }
      if (p->pSatMain->qtail != p->pSatMain->qhead) {
        __assert_fail("p->pSatMain->qtail == p->pSatMain->qhead",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraClaus.c"
                      ,0x4c4,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
      }
    }
    if (p->fTarget != 0) {
      iVar5 = Fra_ClausRunSat0(p);
      if (iVar5 == 0) {
        if (p->fVerbose != 0) {
          printf(" Property fails.  ");
        }
        p->fFail = 1;
      }
      else if (p->fVerbose != 0) {
        printf(" Property holds.  ");
      }
    }
    psVar7 = p->pSatMain;
    if (psVar7->qtail != psVar7->qhead) {
      iVar5 = sat_solver_simplify(psVar7);
      if (iVar5 == 0) {
        __assert_fail("RetValue != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraClaus.c"
                      ,0x4f0,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
      }
      if (p->pSatMain->qtail != p->pSatMain->qhead) {
        __assert_fail("p->pSatMain->qtail == p->pSatMain->qhead",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraClaus.c"
                      ,0x4f1,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
      }
    }
    pVVar9 = p->vClauses;
    if (pVVar9->nSize < 1) {
      local_40 = 0;
    }
    else {
      lVar12 = 0;
      local_40 = 0;
      iVar5 = 0;
      do {
        if (p->vCosts->nSize <= lVar12) {
LAB_0069a92d:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar6 = pVVar9->pArray[lVar12];
        iVar11 = p->vCosts->pArray[lVar12];
        if (iVar11 != -1) {
          if (iVar11 < 1) {
            __assert_fail("Vec_IntEntry( p->vCosts, i ) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraClaus.c"
                          ,0x4ff,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
          }
          if (p->nLutSize < iVar6 - iVar5) {
            __assert_fail("End - Beg <= p->nLutSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraClaus.c"
                          ,0x500,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
          }
          lVar14 = (long)iVar5;
          piVar3 = piVar2 + lVar14;
          iVar11 = Fra_ClausSimInfoCheck(p,piVar3,iVar6 - iVar5);
          if (iVar11 == 0) {
            lVar13 = (long)iVar6;
            lVar10 = lVar14;
            if (iVar5 < iVar6) {
              do {
                *(byte *)(piVar2 + lVar10) = *(byte *)(piVar2 + lVar10) ^ 1;
                lVar10 = lVar10 + 1;
              } while (lVar13 != lVar10);
              iVar11 = sat_solver_solve(p->pSatMain,piVar3,piVar2 + lVar13,(long)p->nBTLimit,0,0,0);
              if (iVar5 < iVar6) {
                do {
                  *(byte *)(piVar2 + lVar14) = *(byte *)(piVar2 + lVar14) ^ 1;
                  lVar14 = lVar14 + 1;
                } while (lVar13 != lVar14);
              }
            }
            else {
              iVar11 = sat_solver_solve(p->pSatMain,piVar3,piVar2 + lVar13,(long)p->nBTLimit,0,0,0);
            }
            psVar7 = p->pSatMain;
            if (iVar11 == -1) {
              if (psVar7->qtail != psVar7->qhead) {
                iVar5 = sat_solver_simplify(psVar7);
                if (iVar5 == 0) {
                  __assert_fail("RetValue != 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraClaus.c"
                                ,0x539,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
                }
                if (p->pSatMain->qtail != p->pSatMain->qhead) {
                  __assert_fail("p->pSatMain->qtail == p->pSatMain->qhead",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraClaus.c"
                                ,0x53a,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
                }
              }
              goto LAB_0069a879;
            }
            Fra_ClausSimInfoRecord(p,psVar7->model + (long)p->pCnf->nVars * (long)p->nFrames);
            pVVar9 = p->vCosts;
            iVar5 = pVVar9->nSize;
          }
          else {
            pVVar9 = p->vCosts;
            iVar5 = pVVar9->nSize;
          }
          if (iVar5 <= lVar12) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          pVVar9->pArray[lVar12] = -1;
          local_40 = local_40 + 1;
        }
LAB_0069a879:
        lVar12 = lVar12 + 1;
        pVVar9 = p->vClauses;
        iVar5 = iVar6;
      } while (lVar12 < pVVar9->nSize);
    }
    pVVar9 = p->vLits;
    if (pVVar9->nSize < 1) {
      return local_40;
    }
    iVar5 = p->nFrames;
    piVar2 = pVVar9->pArray;
    lVar12 = 0;
    do {
      piVar2[lVar12] = piVar2[lVar12] - iVar4 * iVar5;
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar9->nSize);
    return local_40;
  }
  __s = "Error: Main solver is unsat.";
LAB_0069a6ad:
  puts(__s);
  return -1;
LAB_0069a6a6:
  __s = "Error: Solver is UNSAT after adding assumption clauses.";
  goto LAB_0069a6ad;
}

Assistant:

int Fra_ClausInductiveClauses( Clu_Man_t * p )
{
//    Aig_Obj_t * pObjLi, * pObjLo;
    int * pStart, nLitsTot, RetValue, Beg, End, Counter, i, k, f, fFlag;//, Lits[2];
    p->fFail = 0;

    // reset the solver
    if ( p->pSatMain )  sat_solver_delete( p->pSatMain );
    p->pSatMain = (sat_solver *)Cnf_DataWriteIntoSolver( p->pCnf, p->nFrames+1, 0 );
    if ( p->pSatMain == NULL )
    {
        printf( "Error: Main solver is unsat.\n" );
        return -1;
    }  
    Fra_ClausSimInfoClean( p );

/*
    // check if the property holds
    if ( Fra_ClausRunSat0( p ) )
        printf( "Property holds without strengthening.\n" );
    else
        printf( "Property does not hold without strengthening.\n" );
*/
/*
    // add constant registers
    Aig_ManForEachLiLoSeq( p->pAig, pObjLi, pObjLo, i )  
        if ( Aig_ObjFanin0(pObjLi) == Aig_ManConst1(p->pAig) )
        {
            for ( k = 0; k < p->nFrames; k++ )
            {
                Lits[0] = k * 2 * p->pCnf->nVars + toLitCond( p->pCnf->pVarNums[pObjLo->Id], Aig_ObjFaninC0(pObjLi) ); 
                RetValue = sat_solver_addclause( p->pSatMain, Lits, Lits + 1 );
                if ( RetValue == 0 )
                {
                    printf( "Error: Solver is UNSAT after adding constant-register clauses.\n" );
                    return -1;
                }
            }
        }
*/


    // add the proven clauses
    nLitsTot = 2 * p->pCnf->nVars;
    pStart = Vec_IntArray(p->vLitsProven);
    for ( f = 0; f < p->nFrames; f++ )
    {
        Beg = 0;
        Vec_IntForEachEntry( p->vClausesProven, End, i )
        {
            assert( End - Beg <= p->nLutSize );
            // add the clause to all timeframes
            RetValue = sat_solver_addclause( p->pSatMain, pStart + Beg, pStart + End );
            if ( RetValue == 0 )
            {
                printf( "Error: Solver is UNSAT after adding assumption clauses.\n" );
                return -1;
            }
            Beg = End;
        }
        // increment literals
        for ( i = 0; i < Vec_IntSize(p->vLitsProven); i++ )
            p->vLitsProven->pArray[i] += nLitsTot;
    }
    // return clauses back to normal
    nLitsTot = (p->nFrames) * nLitsTot;
    for ( i = 0; i < Vec_IntSize(p->vLitsProven); i++ )
        p->vLitsProven->pArray[i] -= nLitsTot;

/*
    // add the proven clauses
    nLitsTot = 2 * p->pCnf->nVars;
    pStart = Vec_IntArray(p->vLitsProven);
    Beg = 0;
    Vec_IntForEachEntry( p->vClausesProven, End, i )
    {
        assert( End - Beg <= p->nLutSize );
        // add the clause to all timeframes
        RetValue = sat_solver_addclause( p->pSatMain, pStart + Beg, pStart + End );
        if ( RetValue == 0 )
        {
            printf( "Error: Solver is UNSAT after adding assumption clauses.\n" );
            return -1;
        }
        Beg = End;
    }
*/
    
    // add the clauses
    nLitsTot = 2 * p->pCnf->nVars;
    pStart = Vec_IntArray(p->vLits);
    for ( f = 0; f < p->nFrames; f++ )
    {
        Beg = 0;
        Vec_IntForEachEntry( p->vClauses, End, i )
        {
            if ( Vec_IntEntry( p->vCosts, i ) == -1 )
            {
                Beg = End;
                continue;
            }
            assert( Vec_IntEntry( p->vCosts, i ) > 0 );
            assert( End - Beg <= p->nLutSize );
            // add the clause to all timeframes
            RetValue = sat_solver_addclause( p->pSatMain, pStart + Beg, pStart + End );
            if ( RetValue == 0 )
            {
                printf( "Error: Solver is UNSAT after adding assumption clauses.\n" );
                return -1;
            }
            Beg = End;
        }
        // increment literals
        for ( i = 0; i < Vec_IntSize(p->vLits); i++ )
            p->vLits->pArray[i] += nLitsTot;
    }

    // simplify the solver
    if ( p->pSatMain->qtail != p->pSatMain->qhead )
    {
        RetValue = sat_solver_simplify(p->pSatMain);
        assert( RetValue != 0 );
        assert( p->pSatMain->qtail == p->pSatMain->qhead );
    }
  
    // check if the property holds
    if ( p->fTarget )
    {
        if ( Fra_ClausRunSat0( p ) )
        {
            if ( p->fVerbose )
            printf( " Property holds.  " );
        }
        else
        {
            if ( p->fVerbose )
            printf( " Property fails.  " );
    //        return -2;
            p->fFail = 1;
        }
    }

/*
    // add the property for the first K frames
    for ( i = 0; i < p->nFrames; i++ )
    {
        Aig_Obj_t * pObj;
        int Lits[2];
        // set the output literals
        pObj = Aig_ManCo(p->pAig, 0);
        Lits[0] = i * nLitsTot + toLitCond( p->pCnf->pVarNums[pObj->Id], 1 ); 
        // add the clause
        RetValue = sat_solver_addclause( p->pSatMain, Lits, Lits + 1 );
//        assert( RetValue == 1 );
        if ( RetValue == 0 )
        {
            printf( "Error: Solver is UNSAT after adding property for the first K frames.\n" );
            return -1;
        }
    }
*/

    // simplify the solver
    if ( p->pSatMain->qtail != p->pSatMain->qhead )
    {
        RetValue = sat_solver_simplify(p->pSatMain);
        assert( RetValue != 0 );
        assert( p->pSatMain->qtail == p->pSatMain->qhead );
    }


    // check the clause in the last timeframe
    Beg = 0;
    Counter = 0;
    Vec_IntForEachEntry( p->vClauses, End, i )
    {
        if ( Vec_IntEntry( p->vCosts, i ) == -1 )
        {
            Beg = End;
            continue;
        }
        assert( Vec_IntEntry( p->vCosts, i ) > 0 );
        assert( End - Beg <= p->nLutSize );

        if ( Fra_ClausSimInfoCheck(p, pStart + Beg, End - Beg) )
        {
            fFlag = 1;
//            printf( "s-" );

            Beg = End;
            Vec_IntWriteEntry( p->vCosts, i, -1 );
            Counter++;
            continue;
        }
        else
        {
            fFlag = 0;
//            printf( "s?" );
        }

        for ( k = Beg; k < End; k++ )
            pStart[k] = lit_neg( pStart[k] );
        RetValue = sat_solver_solve( p->pSatMain, pStart + Beg, pStart + End, (ABC_INT64_T)p->nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        for ( k = Beg; k < End; k++ )
            pStart[k] = lit_neg( pStart[k] );

        // the problem is not solved
        if ( RetValue != l_False )
        {
//            printf( "S- " );
//            Fra_ClausSimInfoRecord( p, (int*)p->pSatMain->model.ptr + p->nFrames * p->pCnf->nVars );
            Fra_ClausSimInfoRecord( p, (int*)p->pSatMain->model + p->nFrames * p->pCnf->nVars );
//            RetValue = Fra_ClausSimInfoCheck(p, pStart + Beg, End - Beg);
//            assert( RetValue );

            Beg = End;
            Vec_IntWriteEntry( p->vCosts, i, -1 );
            Counter++;
            continue;
        }
//        printf( "S+ " );
//        assert( !fFlag );

/*
        // add the clause
        RetValue = sat_solver_addclause( p->pSatMain, pStart + Beg, pStart + End );
//        assert( RetValue == 1 );
        if ( RetValue == 0 )
        {
            printf( "Error: Solver is UNSAT after adding proved clauses.\n" );
            return -1;
        }
*/
        Beg = End;

        // simplify the solver
        if ( p->pSatMain->qtail != p->pSatMain->qhead )
        {
            RetValue = sat_solver_simplify(p->pSatMain);
            assert( RetValue != 0 );
            assert( p->pSatMain->qtail == p->pSatMain->qhead );
        }
    }

    // return clauses back to normal
    nLitsTot = p->nFrames * nLitsTot;
    for ( i = 0; i < Vec_IntSize(p->vLits); i++ )
        p->vLits->pArray[i] -= nLitsTot;

//    if ( fFail )
//        return -2;
    return Counter;
}